

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O1

bool fs_rename(string_view from,string_view to)

{
  string_view path2;
  string_view path1;
  int iVar1;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  error_code local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  path local_70;
  path local_48;
  
  local_a0._M_value = 0;
  local_90._M_len = in_RDX;
  local_90._M_str = in_RCX;
  local_80._M_len = in_RDI;
  local_80._M_str = in_RSI;
  local_a0._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,&local_80,auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&local_90,auto_format);
  std::filesystem::rename(&local_70,&local_48,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  iVar1 = local_a0._M_value;
  if (local_a0._M_value != 0) {
    path1._M_str = local_80._M_str;
    path1._M_len = local_80._M_len;
    path2._M_str = local_90._M_str;
    path2._M_len = local_90._M_len;
    fname._M_str = "fs_rename";
    fname._M_len = 9;
    fs_print_error(path1,path2,fname,&local_a0);
  }
  return iVar1 == 0;
}

Assistant:

bool
fs_rename(std::string_view from, std::string_view to)
{
  // rename a file or directory
  // existing "to" is overwritten

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/rename
  std::filesystem::rename(from, to, ec);
  if(!ec)
#else
  // https://en.cppreference.com/w/cpp/io/c/rename
  if(std::rename(from.data(), to.data()) == 0)
#endif
    return true;

  fs_print_error(from, to, __func__, ec);
  return false;

}